

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

ssize_t sendto(int __fd,void *__buf,size_t __n,int __flags,sockaddr *__addr,socklen_t __addr_len)

{
  bool bVar1;
  rpchook_t *prVar2;
  int *piVar3;
  pollfd local_64;
  pollfd pf;
  int timeout;
  size_t bytes_written;
  ssize_t ret;
  rpchook_t *lp;
  socklen_t dest_len_local;
  sockaddr *dest_addr_local;
  int flags_local;
  size_t length_local;
  void *message_local;
  ulong uStack_10;
  int socket_local;
  
  if (g_sys_sendto_func == (sendto_pfn_t)0x0) {
    g_sys_sendto_func = (sendto_pfn_t)dlsym(0xffffffffffffffff,"sendto");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1) {
    prVar2 = get_by_fd(__fd);
    if ((prVar2 == (rpchook_t *)0x0) || ((prVar2->user_flag & 0x800U) != 0)) {
      uStack_10 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
    }
    else {
      bytes_written = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
      if (((long)bytes_written < 0) &&
         ((piVar3 = __errno_location(), *piVar3 == 0xb ||
          (piVar3 = __errno_location(), *piVar3 == 0xb)))) {
        bytes_written = 0;
      }
      if ((long)bytes_written < 0) {
        uStack_10 = bytes_written;
      }
      else {
        for (stack0xffffffffffffffa8 = bytes_written; stack0xffffffffffffffa8 < __n;
            register0x00000000 = bytes_written + stack0xffffffffffffffa8) {
          pf.fd = (int)(prVar2->write_timeout).tv_sec * 1000 +
                  (int)((prVar2->write_timeout).tv_usec / 1000);
          memset(&local_64,0,8);
          local_64.events = 0x1c;
          local_64.fd = __fd;
          poll(&local_64,1,pf.fd);
          bytes_written = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len)
          ;
          if ((long)bytes_written < 0) {
            piVar3 = __errno_location();
            if ((*piVar3 == 0xb) || (piVar3 = __errno_location(), *piVar3 == 0xb)) {
              piVar3 = __errno_location();
              *piVar3 = 0x7c5;
            }
            break;
          }
        }
        if (((long)bytes_written < 1) && (stack0xffffffffffffffa8 == 0)) {
          uStack_10 = bytes_written;
        }
        else {
          uStack_10 = stack0xffffffffffffffa8;
        }
      }
    }
  }
  else {
    uStack_10 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
  }
  return uStack_10;
}

Assistant:

ssize_t sendto(int socket, const void *message, size_t length,
	                 int flags, const struct sockaddr *dest_addr,
					               socklen_t dest_len)
{
	/*
		1.no enable sys call ? sys
		2.( !lp || lp is non block ) ? sys
		3.try
		4.wait
		5.try
	*/
	HOOK_SYS_FUNC( sendto );
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	rpchook_t *lp = get_by_fd( socket );
	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	ssize_t ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );

	if( ret < 0 && (EAGAIN == errno || EWOULDBLOCK == errno)){
		ret = 0;
	}

	if(ret<0) return ret;

	size_t bytes_written = ret;
	while(bytes_written < length){
		int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
					+ ( lp->write_timeout.tv_usec / 1000 );


		struct pollfd pf = { 0 };
		pf.fd = socket;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );

		ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
		if(ret <0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		bytes_written += ret ;
	}
	if (ret <= 0 && bytes_written == 0){
		return ret;
	}
	return bytes_written;
}